

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_init.c
# Opt level: O0

void luaL_openlibs(lua_State *L)

{
  long lVar1;
  undefined4 unaff_retaddr;
  int unaff_retaddr_00;
  luaL_Reg *lib;
  lua_State *in_stack_00000018;
  int in_stack_00000024;
  lua_State *in_stack_00000028;
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  luaL_Reg *plVar2;
  
  for (plVar2 = lj_lib_load; *(lua_CFunction *)&((lua_State *)plVar2)->glref != (lua_CFunction)0x0;
      plVar2 = (luaL_Reg *)&((lua_State *)plVar2)->base) {
    lua_pushcclosure(L,(lua_CFunction)lib,unaff_retaddr_00);
    lua_pushstring((lua_State *)lib,(char *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
    lua_call((lua_State *)plVar2,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
  }
  luaL_findtable(in_stack_00000018,L._4_4_,(char *)lib,unaff_retaddr_00);
  for (plVar2 = lj_lib_preload; lVar1._0_4_ = ((lua_State *)plVar2)->glref,
      lVar1._4_4_ = ((lua_State *)plVar2)->gclist, lVar1 != 0;
      plVar2 = (luaL_Reg *)&((lua_State *)plVar2)->base) {
    lua_pushcclosure(L,(lua_CFunction)lib,unaff_retaddr_00);
    lua_setfield(in_stack_00000028,in_stack_00000024,(char *)in_stack_00000018);
  }
  lua_settop((lua_State *)plVar2,in_stack_ffffffffffffffec);
  return;
}

Assistant:

LUALIB_API void luaL_openlibs(lua_State *L)
{
  const luaL_Reg *lib;
  for (lib = lj_lib_load; lib->func; lib++) {
    lua_pushcfunction(L, lib->func);
    lua_pushstring(L, lib->name);
    lua_call(L, 1, 0);
  }
  luaL_findtable(L, LUA_REGISTRYINDEX, "_PRELOAD",
		 sizeof(lj_lib_preload)/sizeof(lj_lib_preload[0])-1);
  for (lib = lj_lib_preload; lib->func; lib++) {
    lua_pushcfunction(L, lib->func);
    lua_setfield(L, -2, lib->name);
  }
  lua_pop(L, 1);
}